

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print_program_info_log.h
# Opt level: O3

bool print_program_info_log(GLuint obj)

{
  GLint GVar1;
  char *__s;
  size_t sVar2;
  ostream *poVar3;
  ulong uVar4;
  GLint charsWritten;
  string log;
  GLint infologLength;
  undefined1 *local_218;
  char *local_210;
  undefined1 local_208 [20];
  GLsizei local_1f4;
  undefined1 *local_1f0;
  long local_1e8;
  undefined1 local_1e0 [16];
  char *local_1d0;
  long local_1c8;
  char local_1c0 [20];
  GLint local_1ac;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1ac = 0;
  local_1f4 = 0;
  (*glad_glGetProgramiv)(obj,0x8b84,&local_1ac);
  GVar1 = local_1ac;
  if (0 < (long)local_1ac) {
    __s = (char *)operator_new__((long)local_1ac);
    (*glad_glGetProgramInfoLog)(obj,GVar1,&local_1f4,__s);
    local_1d0 = local_1c0;
    sVar2 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,__s,__s + sVar2);
    local_218 = local_208;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"ERROR","");
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    poVar3 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\x1b[1m\x1b[31m",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"ERROR",5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\x1b[m",3);
    std::__cxx11::stringbuf::str();
    uVar4 = std::__cxx11::string::find((char *)&local_1d0,(ulong)local_218,0);
    if (uVar4 != 0xffffffffffffffff) {
      do {
        std::__cxx11::string::replace((ulong)&local_1d0,uVar4,local_210,(ulong)local_1f0);
        uVar4 = std::__cxx11::string::find((char *)&local_1d0,(ulong)local_218,uVar4 + local_1e8);
      } while (uVar4 != 0xffffffffffffffff);
    }
    if (local_1f0 != local_1e0) {
      operator_delete(local_1f0);
    }
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
    std::ios_base::~ios_base(local_138);
    if (local_218 != local_208) {
      operator_delete(local_218);
    }
    local_218 = local_208;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"WARNING","");
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    poVar3 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\x1b[1m\x1b[33m",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"WARNING",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\x1b[m",3);
    std::__cxx11::stringbuf::str();
    uVar4 = std::__cxx11::string::find((char *)&local_1d0,(ulong)local_218,0);
    if (uVar4 != 0xffffffffffffffff) {
      do {
        std::__cxx11::string::replace((ulong)&local_1d0,uVar4,local_210,(ulong)local_1f0);
        uVar4 = std::__cxx11::string::find((char *)&local_1d0,(ulong)local_218,uVar4 + local_1e8);
      } while (uVar4 != 0xffffffffffffffff);
    }
    if (local_1f0 != local_1e0) {
      operator_delete(local_1f0);
    }
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
    std::ios_base::~ios_base(local_138);
    if (local_218 != local_208) {
      operator_delete(local_218);
    }
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,local_1d0,local_1c8);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    operator_delete__(__s);
    if (local_1d0 != local_1c0) {
      operator_delete(local_1d0);
    }
  }
  return 0 < GVar1;
}

Assistant:

bool print_program_info_log(const GLuint obj)
{
  GLint infologLength = 0;
  GLint charsWritten  = 0;
  
  glGetProgramiv(obj, GL_INFO_LOG_LENGTH,&infologLength);
  
  if (infologLength > 0)
  {
    char * infoLog = new char[infologLength];
    glGetProgramInfoLog(obj, infologLength, &charsWritten, infoLog);
    std::string log(infoLog);
    find_and_replace_all("ERROR",STR(REDRUM("ERROR")),log);
    find_and_replace_all("WARNING",STR(YELLOWRUM("WARNING")),log);
    std::cerr<<log<<std::endl;
    delete[] infoLog;
    return true;
  }
  return false;
}